

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

int __thiscall ON_Brep::GetMesh(ON_Brep *this,mesh_type mt,ON_SimpleArray<const_ON_Mesh_*> *meshes)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ON_Mesh *mesh;
  ON_Mesh *local_40;
  long local_38;
  
  uVar1 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count;
  ON_SimpleArray<const_ON_Mesh_*>::Reserve(meshes,(long)meshes->m_count + (long)(int)uVar1);
  lVar5 = 0;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
  }
  iVar6 = 0;
  local_38 = (long)(int)uVar1;
  for (; uVar2 * 0xd8 - lVar5 != 0; lVar5 = lVar5 + 0xd8) {
    local_40 = ON_BrepFace::Mesh((ON_BrepFace *)
                                 ((((this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                                    super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                                 lVar5 + -0x5c),mt);
    ON_SimpleArray<const_ON_Mesh_*>::Append(meshes,&local_40);
    iVar6 = iVar6 + (uint)(local_40 == (ON_Mesh *)0x0);
  }
  iVar4 = (int)local_38;
  if (iVar6 == iVar4) {
    iVar6 = 0;
    iVar3 = meshes->m_count - iVar4;
    iVar4 = iVar6;
    if ((-1 < iVar3) && (iVar3 <= meshes->m_capacity)) {
      meshes->m_count = iVar3;
    }
  }
  return iVar4;
}

Assistant:

int ON_Brep::GetMesh( ON::mesh_type mt, ON_SimpleArray<const ON_Mesh*>& meshes ) const
{
  int fcnt = m_F.Count();
  int fi;
  int null_count = 0;
  meshes.Reserve( meshes.Count() + fcnt );
  for ( fi = 0; fi < fcnt; fi++ )
  {
    const ON_Mesh* mesh = m_F[fi].Mesh(mt);
    meshes.Append( mesh );
    if ( !mesh )
    {
      // If some meshes are missing, we have to put
      // a null in the return array so the face-to-mesh
      // correspondence is preserved.
      null_count++;
    }
  }
  if ( null_count == fcnt )
  {
    // If ALL the meshes are missing, return 0.
    meshes.SetCount(meshes.Count()-fcnt);
    fcnt = 0;
  }
  return fcnt;
}